

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTBuilder.cpp
# Opt level: O0

void __thiscall AST::ASTBuilder::removeSelfIfOnlyHasOneChild(ASTBuilder *this)

{
  reference ppAVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  size_type sVar3;
  reference ppAVar4;
  ASTNode *local_18;
  value_type B;
  ASTBuilder *this_local;
  
  B = (value_type)this;
  ppAVar1 = std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>
            ::top(&this->stack);
  local_18 = *ppAVar1;
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::pop
            (&this->stack);
  pdVar2 = ASTNode::getChildren(local_18);
  sVar3 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::size(pdVar2);
  if (sVar3 == 1) {
    pdVar2 = ASTNode::getChildren(local_18);
    ppAVar4 = std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>::at(pdVar2,0);
    local_18 = *ppAVar4;
  }
  std::stack<AST::ASTNode_*,_std::deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>_>::push
            (&this->stack,&local_18);
  return;
}

Assistant:

void AST::ASTBuilder::removeSelfIfOnlyHasOneChild() {
    auto B = stack.top();
    stack.pop();
    if (B->getChildren().size() == 1) B = B->getChildren().at(0);
    stack.push(B);
}